

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O0

void Fxch_ManUpdate(Fxch_Man_t *p,int iDiv)

{
  uint uVar1;
  int iVar2;
  int i_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *p_00;
  int iVarNew;
  int hCube2;
  int hCube1;
  int Lit1;
  int Lit0;
  int i;
  Vec_Int_t *vLitN;
  Vec_Int_t *vLitP;
  Vec_Int_t *vCube2;
  Vec_Int_t *vCube1;
  int iDiv_local;
  Fxch_Man_t *p_local;
  
  uVar1 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar1 & 0x3ffffff);
  uVar1 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar1 & 0x3ffffff);
  iVar2 = Hash_IntObjData0(p->vHash,iDiv);
  i_00 = Hash_IntObjData1(p->vHash,iDiv);
  if (((iVar2 < 0) || (i_00 < 0)) || (i_00 <= iVar2)) {
    __assert_fail("Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x276,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  Vec_WrdPush(&p->vDivs,(long)i_00 << 0x20 | (long)iVar2);
  pVVar8 = Vec_WecEntry(&p->vLits,iVar2);
  pVVar9 = Vec_WecEntry(&p->vLits,i_00);
  Fxch_CompressCubes(p,pVVar8);
  Fxch_CompressCubes(p,pVVar9);
  Vec_IntTwoRemoveCommon(pVVar8,pVVar9,&p->vCubesS);
  Fxch_FilterCubes(p,&p->vCubesS,iVar2,i_00);
  pVVar8 = Vec_WecEntry(&p->vPairs,iDiv);
  iVar3 = Abc_LitNot(iVar2);
  iVar4 = Abc_LitNot(i_00);
  Fxch_CollectDoubles(p,pVVar8,&p->vCubesD,iVar3,iVar4);
  iVar3 = Vec_IntSize(&p->vCubesD);
  if (iVar3 % 2 != 0) {
    __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x28a,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  Vec_IntUniqifyPairs(&p->vCubesD);
  iVar3 = Vec_IntSize(&p->vCubesD);
  if (iVar3 % 2 != 0) {
    __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x28c,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  for (Lit1 = 0; iVar3 = Vec_IntSize(&p->vCubesS), Lit1 < iVar3; Lit1 = Lit1 + 1) {
    iVar3 = Vec_IntEntry(&p->vCubesS,Lit1);
    iVar3 = Pla_CubeNum(iVar3);
    Fxch_TabSingleDivisors(p,iVar3,0);
  }
  for (Lit1 = 0; iVar3 = Vec_IntSize(&p->vCubesD), Lit1 + 1 < iVar3; Lit1 = Lit1 + 2) {
    iVar3 = Vec_IntEntry(&p->vCubesD,Lit1);
    iVar4 = Vec_IntEntry(&p->vCubesD,Lit1 + 1);
    iVar3 = Pla_CubeNum(iVar3);
    Fxch_TabSingleDivisors(p,iVar3,0);
    iVar3 = Pla_CubeNum(iVar4);
    Fxch_TabSingleDivisors(p,iVar3,0);
  }
  for (Lit1 = 0; iVar3 = Vec_IntSize(&p->vCubesS), Lit1 < iVar3; Lit1 = Lit1 + 1) {
    iVar3 = Vec_IntEntry(&p->vCubesS,Lit1);
    iVar3 = Pla_CubeNum(iVar3);
    Fxch_TabDoubleDivisors(p,iVar3,0);
  }
  for (Lit1 = 0; iVar3 = Vec_IntSize(&p->vCubesD), Lit1 + 1 < iVar3; Lit1 = Lit1 + 2) {
    iVar3 = Vec_IntEntry(&p->vCubesD,Lit1);
    iVar4 = Vec_IntEntry(&p->vCubesD,Lit1 + 1);
    iVar3 = Pla_CubeNum(iVar3);
    Fxch_TabDoubleDivisors(p,iVar3,0);
    iVar3 = Pla_CubeNum(iVar4);
    Fxch_TabDoubleDivisors(p,iVar3,0);
  }
  p->nLits = p->nLits + 2;
  iVar3 = Vec_WecSize(&p->vLits);
  Vec_WecPushLevel(&p->vLits);
  pVVar8 = Vec_WecPushLevel(&p->vLits);
  iVar4 = Vec_WecSize(&p->vLits);
  pVVar9 = Vec_WecEntry(&p->vLits,iVar4 + -2);
  for (Lit1 = 0; iVar4 = Vec_IntSize(&p->vCubesS), Lit1 < iVar4; Lit1 = Lit1 + 1) {
    iVar4 = Vec_IntEntry(&p->vCubesS,Lit1);
    pVVar10 = Fxch_ManCube(p,iVar4);
    Fxch_CompressLiterals(pVVar10,iVar2,i_00);
    iVar4 = Pla_CubeNum(iVar4);
    Vec_IntPush(pVVar9,iVar4);
    iVar4 = Abc_Var2Lit(iVar3 / 2,0);
    Vec_IntPush(pVVar10,iVar4);
    p->nLits = p->nLits + -1;
  }
  Lit1 = 0;
  while( true ) {
    iVar4 = Vec_IntSize(&p->vCubesD);
    if (iVar4 <= Lit1 + 1) {
      Vec_IntSort(pVVar8,0);
      Vec_IntSort(pVVar9,0);
      for (Lit1 = 0; iVar2 = Vec_IntSize(&p->vCubesS), Lit1 < iVar2; Lit1 = Lit1 + 1) {
        iVar2 = Vec_IntEntry(&p->vCubesS,Lit1);
        iVar2 = Pla_CubeNum(iVar2);
        Fxch_TabSingleDivisors(p,iVar2,1);
      }
      for (Lit1 = 0; iVar2 = Vec_IntSize(&p->vCubesD), Lit1 + 1 < iVar2; Lit1 = Lit1 + 2) {
        iVar2 = Vec_IntEntry(&p->vCubesD,Lit1);
        Vec_IntEntry(&p->vCubesD,Lit1 + 1);
        iVar2 = Pla_CubeNum(iVar2);
        Fxch_TabSingleDivisors(p,iVar2,1);
      }
      for (Lit1 = 0; iVar2 = Vec_IntSize(&p->vCubesS), Lit1 < iVar2; Lit1 = Lit1 + 1) {
        iVar2 = Vec_IntEntry(&p->vCubesS,Lit1);
        iVar2 = Pla_CubeNum(iVar2);
        Fxch_TabDoubleDivisors(p,iVar2,1);
      }
      for (Lit1 = 0; iVar2 = Vec_IntSize(&p->vCubesD), Lit1 + 1 < iVar2; Lit1 = Lit1 + 2) {
        iVar2 = Vec_IntEntry(&p->vCubesD,Lit1);
        Vec_IntEntry(&p->vCubesD,Lit1 + 1);
        iVar2 = Pla_CubeNum(iVar2);
        Fxch_TabDoubleDivisors(p,iVar2,1);
      }
      return;
    }
    iVar4 = Vec_IntEntry(&p->vCubesD,Lit1);
    iVar7 = Vec_IntEntry(&p->vCubesD,Lit1 + 1);
    pVVar10 = Fxch_ManCube(p,iVar4);
    p_00 = Fxch_ManCube(p,iVar7);
    iVar5 = Pla_CubeLit(iVar4);
    iVar5 = Vec_IntEntry(pVVar10,iVar5);
    iVar6 = Abc_LitNot(iVar2);
    if (iVar5 != iVar6) break;
    iVar7 = Pla_CubeLit(iVar7);
    iVar7 = Vec_IntEntry(p_00,iVar7);
    iVar5 = Abc_LitNot(i_00);
    if (iVar7 != iVar5) {
      __assert_fail("Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                    ,0x2c9,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    iVar7 = Pla_CubeLit(iVar4);
    Fxch_CompressLiterals2(pVVar10,iVar7,-1);
    iVar4 = Pla_CubeNum(iVar4);
    Vec_IntPush(pVVar8,iVar4);
    iVar4 = Abc_Var2Lit(iVar3 / 2,1);
    Vec_IntPush(pVVar10,iVar4);
    iVar4 = Vec_IntSize(p_00);
    p->nLits = p->nLits - iVar4;
    Vec_IntClear(p_00);
    Lit1 = Lit1 + 2;
  }
  __assert_fail("Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0x2c8,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t * p, int iDiv )
{
    Vec_Int_t * vCube1, * vCube2, * vLitP, * vLitN;
    //int nLitsNew = p->nLits - (int)Vec_FltEntry(&p->vWeights, iDiv);
    int i, Lit0, Lit1, hCube1, hCube2, iVarNew;
    //float Diff = Vec_FltEntry(&p->vWeights, iDiv) - (float)((int)Vec_FltEntry(&p->vWeights, iDiv));
    //assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); 
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF );
    Lit0 = Hash_IntObjData0( p->vHash, iDiv );
    Lit1 = Hash_IntObjData1( p->vHash, iDiv );
    assert( Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1 );
    Vec_WrdPush( &p->vDivs, ((word)Lit1 << 32) | (word)Lit0 );

    // if the input cover is not prime, it may happen that we are extracting divisor (x + !x)
    // although it is not strictly correct, it seems to be fine to just skip such divisors
//    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->vHash, iDiv)) == 2 )
//        return;

    // collect single-cube-divisor cubes
    vLitP = Vec_WecEntry(&p->vLits, Lit0);
    vLitN = Vec_WecEntry(&p->vLits, Lit1);
    Fxch_CompressCubes( p, vLitP );
    Fxch_CompressCubes( p, vLitN );
//    Fxch_CollectSingles( vLitP, vLitN, &p->vCubesS );
//    assert( Vec_IntSize(&p->vCubesS) % 2 == 0 );
    Vec_IntTwoRemoveCommon( vLitP, vLitN, &p->vCubesS );
    Fxch_FilterCubes( p, &p->vCubesS, Lit0, Lit1 );

    // collect double-cube-divisor cube pairs
    Fxch_CollectDoubles( p, Vec_WecEntry(&p->vPairs, iDiv), &p->vCubesD, Abc_LitNot(Lit0), Abc_LitNot(Lit1) );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );
    Vec_IntUniqifyPairs( &p->vCubesD );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );

    // subtract cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update

    // subtract cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    }
    //printf( "\n" );

    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        //printf( "%d  ", Pla_CubeNum(hCube2) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update
    }
    //printf( "\n" );

    // create new literals
    p->nLits += 2;
    iVarNew = Vec_WecSize( &p->vLits ) / 2;
    vLitP = Vec_WecPushLevel( &p->vLits );
    vLitN = Vec_WecPushLevel( &p->vLits );
    vLitP = Vec_WecEntry( &p->vLits, Vec_WecSize(&p->vLits) - 2 );
    // update single-cube divisor cubes
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
//        int Lit0s, Lit1s;
        vCube1 = Fxch_ManCube( p, hCube1 );
//        Lit0s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube1));
//        Lit1s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube2));
//        assert( Pla_CubeNum(hCube1) == Pla_CubeNum(hCube2) );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Lit0 );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube2)) == Lit1 );
        Fxch_CompressLiterals( vCube1, Lit0, Lit1 );
//        Vec_IntPush( vLitP, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitP, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 0) );

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        p->nLits--;
    }
    // update double-cube divisor cube pairs
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        vCube1 = Fxch_ManCube( p, hCube1 );
        vCube2 = Fxch_ManCube( p, hCube2 );
        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0) );
        assert( Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1) );
        Fxch_CompressLiterals2( vCube1, Pla_CubeLit(hCube1), -1 );
//        Vec_IntPush( vLitN, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitN, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 1) );
        p->nLits -= Vec_IntSize(vCube2);

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        // remove second cube
        Vec_IntClear( vCube2 ); 
    }
    Vec_IntSort( vLitN, 0 );
    Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update

    // add cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    
    // check predicted improvement: (new SOP lits == old SOP lits - divisor weight)
    //assert( p->nLits == nLitsNew );
}